

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O2

void __thiscall
iu_StdFileUnitTest_x_iutest_x_ReadWrite_Test::Body
          (iu_StdFileUnitTest_x_iutest_x_ReadWrite_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  iuCodeMessage *this_00;
  char *in_R9;
  unsigned_long *val2;
  AssertionResult iutest_ar;
  iuCodeMessage local_260;
  undefined1 local_230 [32];
  StdioFile file;
  char wbuf [17];
  FilePath filename;
  char rbuf [32];
  Fixed local_190;
  
  builtin_strncpy(wbuf,"test1234abcdWXYZ",0x11);
  rbuf[0x10] = '\0';
  rbuf[0x11] = '\0';
  rbuf[0x12] = '\0';
  rbuf[0x13] = '\0';
  rbuf[0x14] = '\0';
  rbuf[0x15] = '\0';
  rbuf[0x16] = '\0';
  rbuf[0x17] = '\0';
  rbuf[0x18] = '\0';
  rbuf[0x19] = '\0';
  rbuf[0x1a] = '\0';
  rbuf[0x1b] = '\0';
  rbuf[0x1c] = '\0';
  rbuf[0x1d] = '\0';
  rbuf[0x1e] = '\0';
  rbuf[0x1f] = '\0';
  rbuf[0] = '\0';
  rbuf[1] = '\0';
  rbuf[2] = '\0';
  rbuf[3] = '\0';
  rbuf[4] = '\0';
  rbuf[5] = '\0';
  rbuf[6] = '\0';
  rbuf[7] = '\0';
  rbuf[8] = '\0';
  rbuf[9] = '\0';
  rbuf[10] = '\0';
  rbuf[0xb] = '\0';
  rbuf[0xc] = '\0';
  rbuf[0xd] = '\0';
  rbuf[0xe] = '\0';
  rbuf[0xf] = '\0';
  file.super_IFile.super_IOutStream._vptr_IOutStream = (_func_int **)&PTR__StdioFile_00180e48;
  file.super_IFile.super_IInStream._vptr_IInStream = (_func_int **)&PTR__StdioFile_00180e98;
  file.m_fp = (FILE *)0x0;
  iutest::detail::iuFilePath::iuFilePath(&filename,"./testdata/unit_file_tests.tmp");
  iVar2 = (*file.super_IFile.super_IOutStream._vptr_IOutStream[5])
                    (&file,filename.m_path._M_dataplus._M_p,2);
  paVar1 = &iutest_ar.m_message.field_2;
  iutest_ar.m_message._M_string_length = 0;
  iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
  iutest_ar.m_result = SUB41(iVar2,0);
  iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_230,(internal *)&iutest_ar,
               (AssertionResult *)"file.Open(filename.string().c_str(), iutest::IFile::OpenWrite)",
               "false","true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
               ,0x35,(char *)local_230._0_8_);
    local_260._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_260,&local_190);
LAB_0014cb29:
    std::__cxx11::string::~string((string *)&local_260);
    this_00 = (iuCodeMessage *)local_230;
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest_ar.m_result = iutest::StdioFile::Write(&file,wbuf,4,4);
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    if (!iutest_ar.m_result) {
      iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)local_230,(internal *)&iutest_ar,
                 (AssertionResult *)"file.Write(wbuf, 4, 4)","false","true",in_R9);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
                 ,0x36,(char *)local_230._0_8_);
      local_260._44_4_ = 2;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_260,&local_190);
      goto LAB_0014cb29;
    }
    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::~string((string *)&iutest_ar);
    iVar2 = (*file.super_IFile.super_IOutStream._vptr_IOutStream[5])
                      (&file,filename.m_path._M_dataplus._M_p,1);
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_result = SUB41(iVar2,0);
    if (iutest_ar.m_result == false) {
      iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)local_230,(internal *)&iutest_ar,
                 (AssertionResult *)"file.Open(filename.string().c_str(), iutest::IFile::OpenRead)",
                 "false","true",in_R9);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
                 ,0x37,(char *)local_230._0_8_);
      local_260._44_4_ = 2;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_260,&local_190);
      goto LAB_0014cb29;
    }
    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest_ar.m_result = iutest::StdioFile::Read(&file,rbuf,4,4);
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    if (!iutest_ar.m_result) {
      iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)local_230,(internal *)&iutest_ar,
                 (AssertionResult *)"file.Read(rbuf, 4, 4)","false","true",in_R9);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
                 ,0x38,(char *)local_230._0_8_);
      local_260._44_4_ = 2;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_260,&local_190);
      goto LAB_0014cb29;
    }
    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::~string((string *)&iutest_ar);
    val2 = &iutest_type_traits::enabler_t<void>::value;
    iutest::internal::CmpHelperSTREQ<char*,char*>
              (&iutest_ar,(internal *)"wbuf","rbuf",wbuf,rbuf,
               (char *)&iutest_type_traits::enabler_t<void>::value,
               (type **)iutest_ar.m_message._M_dataplus._M_p);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
                 ,0x39,iutest_ar.m_message._M_dataplus._M_p);
      local_260._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_260,&local_190);
      std::__cxx11::string::~string((string *)&local_260);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_260.m_message._M_dataplus._M_p._0_4_ = 0;
    local_190.super_Message.m_stream.super_iu_stringstream._0_8_ =
         iutest::internal::posix::FileSize(file.m_fp);
    iutest::internal::CmpHelperLT<unsigned_int,unsigned_long>
              (&iutest_ar,(internal *)"0u","file.GetSize()",(char *)&local_260,(uint *)&local_190,
               val2);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
                 ,0x3a,iutest_ar.m_message._M_dataplus._M_p);
      local_260._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_260,&local_190);
      std::__cxx11::string::~string((string *)&local_260);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_260.m_message._M_dataplus._M_p._0_4_ = 0;
    local_190.super_Message.m_stream.super_iu_stringstream._0_8_ = 0;
    iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (&iutest_ar,(internal *)"0u","::iutest::StdioFile::GetSize(__null)",(char *)&local_260
               ,(uint *)&local_190,val2);
    if (iutest_ar.m_result != false) goto LAB_0014cb4a;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
               ,0x3b,iutest_ar.m_message._M_dataplus._M_p);
    local_260._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_260,&local_190);
    this_00 = &local_260;
  }
  std::__cxx11::string::~string((string *)this_00);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_0014cb4a:
  std::__cxx11::string::~string((string *)&iutest_ar);
  std::__cxx11::string::~string((string *)&filename);
  iutest::StdioFile::~StdioFile(&file);
  return;
}

Assistant:

IUTEST(StdFileUnitTest, ReadWrite)
{
    char wbuf[] = "test1234abcdWXYZ";
    char rbuf[32] = { 0 };
    ::iutest::StdioFile file;
    ::iutest::internal::FilePath filename("./testdata/unit_file_tests.tmp");
    IUTEST_ASSERT_TRUE( file.Open(filename.string().c_str(), iutest::IFile::OpenWrite) );
    IUTEST_ASSERT_TRUE( file.Write(wbuf, 4, 4));
    IUTEST_ASSERT_TRUE( file.Open(filename.string().c_str(), iutest::IFile::OpenRead) );
    IUTEST_ASSERT_TRUE( file.Read(rbuf, 4, 4));
    IUTEST_EXPECT_STREQ(wbuf, rbuf);
    IUTEST_EXPECT_LT(0u, file.GetSize());
    IUTEST_EXPECT_EQ(0u, ::iutest::StdioFile::GetSize(NULL));
}